

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int CRYPTO_memcmp(void *a,void *b,size_t len)

{
  int i;
  uint8_t r;
  int n_local;
  uint8_t *b_local;
  uint8_t *a_local;
  undefined4 local_4;
  
  r = '\0';
  if (((a == (void *)0x0) || (b == (void *)0x0)) || ((int)len < 0)) {
    local_4 = 0;
  }
  else {
    for (i = 0; i < (int)len; i = i + 1) {
      r = r | *(byte *)((long)a + (long)i) ^ *(byte *)((long)b + (long)i);
    }
    local_4 = (uint)(r != '\0');
  }
  return local_4;
}

Assistant:

int CRYPTO_memcmp(const uint8_t *a, const uint8_t *b, int n)
{
    uint8_t r = 0;
    if (a == NULL || b == NULL || n < 0)
        return 0;

    for (int i = 0; i < n; i++) 
        r |= (a[i] ^ b[i]);

    return (r != 0);
}